

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O3

void event_go_to_breakfast_time(tgestate_t *state)

{
  uint8_t *puVar1;
  byte bVar2;
  route_t route;
  long lVar3;
  
  state->bell = '(';
  queue_message(state,message_BREAKFAST_TIME);
  if (state->in_solitary == '\0') {
    puVar1 = &state->vischars[0].flags;
    *puVar1 = *puVar1 & 0xbf;
    state->vischars[0].route.index = '\x10';
    state->vischars[0].route.step = '\0';
    set_route(state,state->vischars);
  }
  bVar2 = 0x10;
  lVar3 = 0;
  do {
    route.step = '\0';
    route.index = bVar2;
    set_character_route(state,"\f\r\x14\x15\x16\x0e\x0f\x17\x18\x19"[lVar3],route);
    bVar2 = bVar2 + ((char)lVar3 == '\x04');
    lVar3 = lVar3 + 1;
  } while ((char)lVar3 != '\n');
  return;
}

Assistant:

static void event_go_to_breakfast_time(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  queue_message(state, message_BREAKFAST_TIME);
  set_route_go_to_breakfast(state);
}